

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_lib_module.cc
# Opt level: O2

void __thiscall
tvm::runtime::SystemLibModuleNode::RegisterSymbol(SystemLibModuleNode *this,string *name,void *ptr)

{
  bool bVar1;
  ostream *poVar2;
  iterator iVar3;
  mapped_type *ppvVar4;
  void **ctx_addr;
  LogMessageFatal local_1b0;
  
  bVar1 = std::operator==(name,"__tvm_module_ctx");
  if (bVar1) {
    *(SystemLibModuleNode **)ptr = this;
  }
  else {
    bVar1 = std::operator==(name,"__tvm_dev_mblob");
    if (bVar1) {
      if (this->module_blob_ != (void *)0x0) {
        dmlc::LogMessageFatal::LogMessageFatal
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/system_lib_module.cc"
                   ,0x4c);
        poVar2 = std::operator<<((ostream *)&local_1b0,"Check failed: module_blob_ == nullptr");
        poVar2 = std::operator<<(poVar2,": ");
        std::operator<<(poVar2,"Resetting mobule blob?");
        dmlc::LogMessageFatal::~LogMessageFatal(&local_1b0);
      }
      this->module_blob_ = ptr;
    }
    else {
      iVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->tbl_)._M_h,name);
      if ((iVar3.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_true>
           ._M_cur != (__node_type *)0x0) &&
         (*(void **)((long)iVar3.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_true>
                           ._M_cur + 0x28) != ptr)) {
        dmlc::LogMessage::LogMessage
                  ((LogMessage *)&local_1b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/system_lib_module.cc"
                   ,0x51);
        poVar2 = std::operator<<((ostream *)local_1b0._0_8_,"SystemLib symbol ");
        poVar2 = std::operator<<(poVar2,(string *)name);
        poVar2 = std::operator<<(poVar2," get overriden to a different address ");
        poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
        poVar2 = std::operator<<(poVar2,"->");
        std::ostream::_M_insert<void_const*>(poVar2);
        dmlc::LogMessage::~LogMessage((LogMessage *)&local_1b0);
      }
      ppvVar4 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->tbl_,name);
      *ppvVar4 = ptr;
    }
  }
  return;
}

Assistant:

void RegisterSymbol(const std::string &name, void *ptr) {
    /* [RISCV-DLR] multi-threading is not supported, so lock is unnecessary */
    //std::lock_guard<std::mutex> lock(mutex_);
    if (name == symbol::tvm_module_ctx) {
      void **ctx_addr = reinterpret_cast<void **>(ptr);
      *ctx_addr = this;
    } else if (name == symbol::tvm_dev_mblob) {
      // Record pointer to content of submodules to be loaded.
      // We defer loading submodules to the first call to GetFunction().
      // The reason is that RegisterSymbol() gets called when initializing the
      // syslib (i.e. library loading time), and the registeries aren't ready
      // yet. Therefore, we might not have the functionality to load submodules
      // now.
      CHECK(module_blob_ == nullptr) << "Resetting mobule blob?";
      module_blob_ = ptr;
    } else {
      auto it = tbl_.find(name);
      if (it != tbl_.end() && ptr != it->second) {
        LOG(WARNING) << "SystemLib symbol " << name
                     << " get overriden to a different address "
                     << ptr << "->" << it->second;
      }
      tbl_[name] = ptr;
    }
  }